

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_resetWithTestVariable_Test::Clone_resetWithTestVariable_Test
          (Clone_resetWithTestVariable_Test *this)

{
  Clone_resetWithTestVariable_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Clone_resetWithTestVariable_Test_00125038;
  return;
}

Assistant:

TEST(Clone, resetWithTestVariable)
{
    auto r = libcellml::Reset::create();
    auto v = libcellml::Variable::create();

    r->setId("unique");
    r->setOrder(43);
    r->setTestVariable(v);

    auto rClone = r->clone();

    compareReset(r, rClone);
}